

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

int xp_compute_pk(CHAR_DATA *ch,CHAR_DATA *victim,int members)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  float fVar4;
  float fVar5;
  __type_conflict2 _Var6;
  bool recentpk;
  float totalpk;
  float netpk;
  float xp;
  int i;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  float fVar7;
  int iVar8;
  int local_4;
  
  bVar1 = false;
  bVar2 = is_npc(in_stack_ffffffffffffffc8);
  if ((bVar2) || (bVar2 = is_npc(in_stack_ffffffffffffffc8), bVar2)) {
    local_4 = 0;
  }
  else {
    iVar8 = 0;
    while( true ) {
      bVar2 = false;
      if ((*(long *)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)iVar8 * 8) != 0) &&
         (bVar2 = false, **(char **)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)iVar8 * 8) != '\0')) {
        bVar2 = iVar8 < 0x5f;
      }
      if (!bVar2) goto LAB_005e6c10;
      bVar2 = str_cmp(*(char **)(*(long *)(in_RDI + 0xc0) + 0xb0 + (long)iVar8 * 8),
                      *(char **)(in_RSI + 0xe8));
      if (!bVar2) break;
      iVar8 = iVar8 + 1;
    }
    bVar1 = true;
LAB_005e6c10:
    if (*(short *)(in_RSI + 0x138) < 0xf) {
      fVar7 = 0.0;
    }
    else {
      if (*(short *)(in_RSI + 0x138) < 0x14) {
        iVar3 = (int)*(short *)(in_RSI + 0x138);
      }
      else if (*(short *)(in_RSI + 0x138) < 0x19) {
        iVar3 = (int)*(short *)(in_RSI + 0x138) << 1;
      }
      else if (*(short *)(in_RSI + 0x138) < 0x1e) {
        iVar3 = (int)*(short *)(in_RSI + 0x138) << 2;
      }
      else if (*(short *)(in_RSI + 0x138) < 0x23) {
        iVar3 = (int)*(short *)(in_RSI + 0x138) << 3;
      }
      else if (*(short *)(in_RSI + 0x138) < 0x28) {
        iVar3 = *(short *)(in_RSI + 0x138) * 0xc;
      }
      else if (*(short *)(in_RSI + 0x138) < 0x2d) {
        iVar3 = (int)*(short *)(in_RSI + 0x138) << 4;
      }
      else {
        iVar3 = *(short *)(in_RSI + 0x138) * 0x14;
      }
      fVar7 = (float)iVar3;
    }
    fVar7 = ((float)((int)*(short *)(in_RSI + 0x138) - (int)*(short *)(in_RDI + 0x138)) * 0.05 + 1.0
            ) * fVar7;
    bVar2 = is_good(in_stack_ffffffffffffffc8);
    if (bVar2) {
      bVar2 = is_good(in_stack_ffffffffffffffc8);
      if (bVar2) {
        send_to_char((char *)CONCAT44(in_EDX,iVar8),
                     (CHAR_DATA *)CONCAT44(fVar7,in_stack_ffffffffffffffd8));
        fVar7 = 0.0;
      }
      bVar2 = is_neutral(in_stack_ffffffffffffffc8);
      if (bVar2) {
        fVar7 = fVar7 / 2.0;
      }
      bVar2 = is_evil(in_stack_ffffffffffffffc8);
      if (bVar2) {
        fVar7 = fVar7 * 1.25;
      }
      fVar7 = (float)(*(short *)(*(long *)(in_RSI + 0xc0) + 0x96) * 5) + fVar7;
    }
    bVar2 = is_neutral(in_stack_ffffffffffffffc8);
    if (bVar2) {
      bVar2 = is_good(in_stack_ffffffffffffffc8);
      if (bVar2) {
        if (*(short *)(*(long *)(in_RDI + 0xc0) + 0x96) <
            *(short *)(*(long *)(in_RDI + 0xc0) + 0x9a)) {
          fVar7 = fVar7 * 1.2;
        }
        if (*(short *)(*(long *)(in_RDI + 0xc0) + 0x9a) <
            *(short *)(*(long *)(in_RDI + 0xc0) + 0x96)) {
          fVar7 = fVar7 * 0.8;
        }
      }
      bVar2 = is_evil(in_stack_ffffffffffffffc8);
      if (bVar2) {
        if (*(short *)(*(long *)(in_RDI + 0xc0) + 0x9a) <
            *(short *)(*(long *)(in_RDI + 0xc0) + 0x96)) {
          fVar7 = fVar7 * 1.2;
        }
        if (*(short *)(*(long *)(in_RDI + 0xc0) + 0x96) <
            *(short *)(*(long *)(in_RDI + 0xc0) + 0x9a)) {
          fVar7 = fVar7 * 0.8;
        }
      }
    }
    if ((*(short *)(in_RDI + 0x132) != 0) && (*(short *)(in_RSI + 0x132) == 0)) {
      fVar7 = fVar7 * 0.8;
    }
    if ((*(short *)(in_RDI + 0x132) == 0) && (*(short *)(in_RSI + 0x132) != 0)) {
      fVar7 = fVar7 * 1.2;
    }
    fVar4 = *(float *)(*(long *)(in_RSI + 0xc0) + 0x9c) -
            *(float *)(*(long *)(in_RSI + 0xc0) + 0xac);
    fVar5 = *(float *)(*(long *)(in_RSI + 0xc0) + 0x9c) +
            *(float *)(*(long *)(in_RSI + 0xc0) + 0xac);
    if (5.0 < fVar5) {
      fVar7 = (fVar4 / fVar5 + 1.0) * fVar7;
    }
    _Var6 = std::pow<int,int>(0,0x5e70e6);
    fVar7 = (float)((double)fVar7 / _Var6);
    if (bVar1) {
      fVar7 = 0.0;
      send_to_char((char *)CONCAT44(in_EDX,iVar8),(CHAR_DATA *)(ulong)(uint)fVar4);
    }
    local_4 = (int)fVar7;
  }
  return local_4;
}

Assistant:

int xp_compute_pk(CHAR_DATA *ch, CHAR_DATA *victim, int members)
{
	int i;
	float xp, netpk, totalpk;
	bool recentpk = false;

	if (is_npc(ch) || is_npc(victim))
		return 0;

	for (i = 0; ch->pcdata->recentkills[i] && *(ch->pcdata->recentkills[i]) != '\0' && i < 95; i++)
	{
		if (!str_cmp(ch->pcdata->recentkills[i], victim->name))
		{
			recentpk = true;
			break;
		}
	}

	/* We don't want to encourage low-level PKing */

	if (victim->level < 15)
		xp = 0;
	else if (victim->level < 20)
		xp = victim->level;
	else if (victim->level < 25)
		xp = victim->level * 2;
	else if (victim->level < 30)
		xp = victim->level * 4;
	else if (victim->level < 35)
		xp = victim->level * 8;
	else if (victim->level < 40)
		xp = victim->level * 12;
	else if (victim->level < 45)
		xp = victim->level * 16;
	else
		xp = victim->level * 20;

	/* Level mods */

	xp *= (float)(1 + (float)(0.05 * (victim->level - ch->level)));

	/* Alignment mods */

	if (is_good(ch))
	{
		if (is_good(victim))
		{
			send_to_char("With the final strike, you feel a twinge in your soul.\n\r", ch);
			xp = 0;
		}

		if (is_neutral(victim))
			xp /= 2;

		if (is_evil(victim))
			xp *= 1.25;

		xp += 5 * victim->pcdata->kills[PK_GOOD];
	}

	if (is_neutral(ch))
	{
		if (is_good(victim))
		{
			if (ch->pcdata->kills[PK_GOOD] < ch->pcdata->kills[PK_EVIL])
				xp *= 1.2;

			if (ch->pcdata->kills[PK_GOOD] > ch->pcdata->kills[PK_EVIL])
				xp *= 0.8;
		}

		if (is_evil(victim))
		{
			if (ch->pcdata->kills[PK_GOOD] > ch->pcdata->kills[PK_EVIL])
				xp *= 1.2;

			if (ch->pcdata->kills[PK_GOOD] < ch->pcdata->kills[PK_EVIL])
				xp *= 0.8;
		}
	}

	/* Cabal mods */

	if (ch->cabal && !victim->cabal)
		xp *= 0.8;

	if (!ch->cabal && victim->cabal)
		xp *= 1.2;

	/* Victim PK mods */

	netpk = victim->pcdata->frags[PK_KILLS] - victim->pcdata->fragged;
	totalpk = victim->pcdata->frags[PK_KILLS] + victim->pcdata->fragged;

	if (totalpk > 5)
		xp *= (1 + (netpk / totalpk));

	/* We do not reward gangbanging */

	xp /= pow(members, 2);

	/* We do not reward multikilling */

	if (recentpk)
	{
		xp = 0;
		send_to_char("You have little more to learn from slaying this foe repeatedly.\n\r", ch);
	}

	return (int)xp;
}